

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

iterator * __thiscall
pybind11::detail::values_and_holders::begin
          (iterator *__return_storage_ptr__,values_and_holders *this)

{
  instance *piVar1;
  type_vec *ptVar2;
  pointer pptVar3;
  type_info *ptVar4;
  anon_union_24_2_63b86169_for_instance_1 *paVar5;
  
  piVar1 = this->inst;
  ptVar2 = this->tinfo;
  __return_storage_ptr__->inst = piVar1;
  __return_storage_ptr__->types = ptVar2;
  pptVar3 = (ptVar2->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pptVar3 ==
      (ptVar2->
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    ptVar4 = (type_info *)0x0;
  }
  else {
    ptVar4 = *pptVar3;
  }
  (__return_storage_ptr__->curr).inst = piVar1;
  (__return_storage_ptr__->curr).index = 0;
  (__return_storage_ptr__->curr).type = ptVar4;
  paVar5 = &piVar1->field_1;
  if ((piVar1->field_0x30 & 2) == 0) {
    paVar5 = (anon_union_24_2_63b86169_for_instance_1 *)paVar5->simple_value_holder[0];
  }
  (__return_storage_ptr__->curr).vh = (void **)paVar5;
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(inst, &tinfo); }